

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool vkb::detail::check_layers_supported
               (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *available_layers,
               vector<const_char_*,_std::allocator<const_char_*>_> *layer_names)

{
  bool bVar1;
  reference ppcVar2;
  bool found;
  char **layer_name;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range2;
  bool all_found;
  vector<const_char_*,_std::allocator<const_char_*>_> *layer_names_local;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *available_layers_local;
  
  __range2._7_1_ = true;
  __end2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(layer_names);
  layer_name = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(layer_names);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                *)&layer_name);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&__end2);
    bVar1 = check_layer_supported(available_layers,*ppcVar2);
    if (!bVar1) {
      __range2._7_1_ = false;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator++(&__end2);
  }
  return __range2._7_1_;
}

Assistant:

bool check_layers_supported(std::vector<VkLayerProperties> const& available_layers, std::vector<const char*> const& layer_names) {
    bool all_found = true;
    for (const auto& layer_name : layer_names) {
        bool found = check_layer_supported(available_layers, layer_name);
        if (!found) all_found = false;
    }
    return all_found;
}